

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cn-cbor.c
# Opt level: O1

void cn_cbor_free(cn_cbor *cb)

{
  cn_cbor *__ptr;
  
  if (cb != (cn_cbor *)0x0) {
    if (cb->parent != (cn_cbor *)0x0) {
      __assert_fail("!p || !p->parent",
                    "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/cn-cbor/repo/src/cn-cbor.c"
                    ,0x22,"void cn_cbor_free(cn_cbor *)");
    }
    do {
      do {
        __ptr = cb;
        cb = __ptr->first_child;
      } while (__ptr->first_child != (cn_cbor *)0x0);
      cb = __ptr->next;
      if (cb == (cn_cbor *)0x0) {
        cb = __ptr->parent;
        if (cb == (cn_cbor *)0x0) {
          cb = (cn_cbor *)0x0;
        }
        else {
          cb->first_child = (cn_cbor *)0x0;
        }
      }
      free(__ptr);
    } while (cb != (cn_cbor *)0x0);
  }
  return;
}

Assistant:

MYLIB_EXPORT
void cn_cbor_free(cn_cbor* cb CBOR_CONTEXT) {
  cn_cbor* p = (cn_cbor*) cb;
  assert(!p || !p->parent);
  while (p) {
    cn_cbor* p1;
    while ((p1 = p->first_child)) { /* go down */
      p = p1;
    }
    if (!(p1 = p->next)) {   /* go up next */
      if ((p1 = p->parent))
        p1->first_child = 0;
    }
    CN_CBOR_FREE_CONTEXT(p);
    p = p1;
  }
}